

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O0

void inner_loop<true,false>
               (cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float cost,
               uint32_t *prediction,float *score,float *partial_prediction,bool query_this_label,
               bool *query_needed)

{
  byte bVar1;
  ostream *poVar2;
  uint in_ECX;
  long in_RDX;
  long in_RDI;
  uint *in_R8;
  example *in_R9;
  float in_XMM0_Da;
  vw *all;
  byte in_stack_00000010;
  float in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc0;
  size_t i_00;
  undefined7 in_stack_ffffffffffffffc8;
  
  bVar1 = in_stack_00000010 & 1;
  LEARNER::learner<char,_example>::predict
            ((learner<char,_example> *)in_R9,
             (example *)(CONCAT17(in_stack_00000010,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffc0);
  i_00 = *(size_t *)(in_RDI + 0x38);
  *(undefined4 *)(in_RDX + 0x682c) = 0x3f800000;
  *(undefined4 *)(in_RDX + 0x6870) = 0x3f800000;
  if (((uint)*score & 1) == 0) {
    *(undefined4 *)(in_RDX + 0x6828) = 0x7f7fffff;
  }
  else {
    *(float *)(in_RDX + 0x6828) = in_XMM0_Da;
    if ((in_XMM0_Da < *(float *)(in_RDI + 0xc)) ||
       (*(float *)(in_RDI + 8) <= in_XMM0_Da && in_XMM0_Da != *(float *)(in_RDI + 8))) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"warning: cost ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_XMM0_Da);
      poVar2 = std::operator<<(poVar2," outside of cost range [");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 0xc));
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(float *)(in_RDI + 8));
      poVar2 = std::operator<<(poVar2,"]!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  if ((*(float *)(in_RDX + 0x6828) != 3.4028235e+38) || (NAN(*(float *)(in_RDX + 0x6828)))) {
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)in_R9,(example *)CONCAT17(bVar1,in_stack_ffffffffffffffc8),
               i_00);
  }
  *(undefined4 *)&all->sd = *(undefined4 *)(in_RDX + 0x68a8);
  if (*(float *)&(in_R9->super_example_predict).indices._begin <= *(float *)(in_RDX + 0x68a8)) {
    if (((*(float *)(in_RDX + 0x68a8) != *(float *)&(in_R9->super_example_predict).indices._begin)
        || (NAN(*(float *)(in_RDX + 0x68a8)) ||
            NAN(*(float *)&(in_R9->super_example_predict).indices._begin))) || (*in_R8 <= in_ECX))
    goto LAB_002fa460;
  }
  *(undefined4 *)&(in_R9->super_example_predict).indices._begin = *(undefined4 *)(in_RDX + 0x68a8);
  *in_R8 = in_ECX;
LAB_002fa460:
  add_passthrough_feature_magic
            (in_R9,CONCAT17(bVar1,in_stack_ffffffffffffffc8),i_00,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

inline void inner_loop(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float cost, uint32_t& prediction,
    float& score, float& partial_prediction, bool query_this_label, bool& query_needed)
{
  base.predict(ec, i - 1);
  // cerr << "base.predict ==> partial_prediction=" << ec.partial_prediction << endl;
  if (is_learn)
  {
    vw& all = *cs_a.all;
    ec.l.simple.weight = 1.;
    ec.weight = 1.;
    if (is_simulation)
    {
      // In simulation mode
      if (query_this_label)
      {
        ec.l.simple.label = cost;
        all.sd->queries += 1;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }
    else
    {
      // In reduction mode.
      // If the cost of this label was previously queried, then it should be available for learning now.
      // If the cost of this label was not queried, then skip it.
      if (query_needed)
      {
        ec.l.simple.label = cost;
        if ((cost < cs_a.cost_min) || (cost > cs_a.cost_max))
          cerr << "warning: cost " << cost << " outside of cost range [" << cs_a.cost_min << ", " << cs_a.cost_max
               << "]!" << endl;
      }
      else
        ec.l.simple.label = FLT_MAX;
    }

    if (ec.l.simple.label != FLT_MAX)
      base.learn(ec, i - 1);
  }
  else if (!is_simulation)
    // Prediction in reduction mode could be used by upper layer to ask whether this label needs to be queried.
    // So we return that.
    query_needed = query_this_label;

  partial_prediction = ec.partial_prediction;
  if (ec.partial_prediction < score || (ec.partial_prediction == score && i < prediction))
  {
    score = ec.partial_prediction;
    prediction = i;
  }
  add_passthrough_feature(ec, i, ec.partial_prediction);
}